

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

void VP8LClear(VP8LDecoder *dec)

{
  uint32_t **ppuVar1;
  long lVar2;
  
  ClearMetadata(&dec->hdr);
  WebPSafeFree(dec->pixels);
  dec->pixels = (uint32_t *)0x0;
  if (0 < dec->next_transform) {
    ppuVar1 = &dec->transforms[0].data;
    lVar2 = 0;
    do {
      WebPSafeFree(*ppuVar1);
      *ppuVar1 = (uint32_t *)0x0;
      lVar2 = lVar2 + 1;
      ppuVar1 = ppuVar1 + 3;
    } while (lVar2 < dec->next_transform);
  }
  dec->next_transform = 0;
  dec->transforms_seen = 0;
  WebPSafeFree(dec->rescaler_memory);
  dec->rescaler_memory = (uint8_t *)0x0;
  dec->output = (WebPDecBuffer *)0x0;
  return;
}

Assistant:

static void VP8LClear(VP8LDecoder* const dec) {
  int i;
  if (dec == NULL) return;
  ClearMetadata(&dec->hdr);

  WebPSafeFree(dec->pixels);
  dec->pixels = NULL;
  for (i = 0; i < dec->next_transform; ++i) {
    ClearTransform(&dec->transforms[i]);
  }
  dec->next_transform = 0;
  dec->transforms_seen = 0;

  WebPSafeFree(dec->rescaler_memory);
  dec->rescaler_memory = NULL;

  dec->output = NULL;   // leave no trace behind
}